

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMLSSerializerImpl::setParameter(DOMLSSerializerImpl *this,XMLCh *featName,bool state)

{
  bool bVar1;
  DOMException *this_00;
  int local_20;
  byte local_19;
  int featureId;
  bool state_local;
  XMLCh *featName_local;
  DOMLSSerializerImpl *this_local;
  
  local_20 = -1;
  local_19 = state;
  _featureId = featName;
  featName_local = (XMLCh *)this;
  checkFeature(this,featName,true,&local_20);
  bVar1 = canSetFeature(this,local_20,(bool)(local_19 & 1));
  if (!bVar1) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,9,0,this->fMemoryManager);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  setFeature(this,local_20,(bool)(local_19 & 1));
  if ((local_20 == 0) && ((local_19 & 1) != 0)) {
    setFeature(this,3,false);
    setFeature(this,10,false);
    setFeature(this,1,false);
    setFeature(this,9,false);
  }
  if ((((local_20 == 3) || (local_20 == 1)) || (local_20 == 9)) && ((local_19 & 1) != 0)) {
    setFeature(this,0,false);
  }
  return;
}

Assistant:

void DOMLSSerializerImpl::setParameter(const XMLCh* featName
                                     , bool         state)
{
    int featureId = INVALID_FEATURE_ID;
    checkFeature(featName, true, featureId);

    if (!canSetFeature(featureId, state))
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

    setFeature(featureId, state);

    //
    // setting "canonical-form" to true will set the parameters "format-pretty-print",
    // "discard-default-content", and "xml-declaration", to false
    //
    if ((featureId == CANONICAL_FORM_ID) && state)
    {
        setFeature(FORMAT_PRETTY_PRINT_ID, false);
        setFeature(FORMAT_PRETTY_PRINT_1ST_LEVEL_ID, false);
        setFeature(DISCARD_DEFAULT_CONTENT_ID, false);
        setFeature(XML_DECLARATION, false);
    }
    // Setting one of those parameters to true will set "canonical-form" to false.
    if ((featureId == FORMAT_PRETTY_PRINT_ID || featureId == DISCARD_DEFAULT_CONTENT_ID || featureId == XML_DECLARATION) && state)
        setFeature(CANONICAL_FORM_ID, false);
}